

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_funcs.c
# Opt level: O3

ktx_error_code_e ktxLoadOpenGLLibrary(void)

{
  ktx_error_code_e kVar1;
  
  kVar1 = KTX_SUCCESS;
  if (openGLLoaded == '\0') {
    kVar1 = KTX_SUCCESS;
    ktxOpenGLModuleHandle = (void *)dlopen(0,1);
    if (ktxOpenGLModuleHandle == (void *)0x0) {
      ktxLoadOpenGLLibrary_cold_1();
      kVar1 = KTX_LIBRARY_NOT_LINKED;
    }
  }
  return kVar1;
}

Assistant:

ktx_error_code_e
ktxLoadOpenGLLibrary(void)
{
    if (openGLLoaded)
        return KTX_SUCCESS;

    // Look for OpenGL module and set up default GetProcAddress.
    ktxOpenGLModuleHandle = GetOpenGLModuleHandle(RTLD_LAZY);
    if (ktxOpenGLModuleHandle == NULL) {
        fprintf(stderr, "OpenGL lib not linked or loaded by application.\n");
        // Normal use is for this constructor to be called by an
        // application that has completed OpenGL initialization. In that
        // case the only cause for failure would be a coding error in our
        // library loading. The only other cause would be an application
        // calling GLUpload without having initialized OpenGL.
#if defined(DEBUG)
        abort();
#else
        return KTX_LIBRARY_NOT_LINKED; // So release version doesn't crash.
#endif
    }
    return KTX_SUCCESS;
}